

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLOptions.h
# Opt level: O0

void __thiscall CLOptions::PrintHelp(CLOptions *this,string *executable_name)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  ostream *poVar4;
  ulong uVar5;
  pointer ppVar6;
  pointer ppVar7;
  pointer ppVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  string *in_RSI;
  double dVar11;
  iterator str_itr;
  iterator int_itr;
  iterator dbl_itr;
  iterator bool_itr;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffcb8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
  *in_stack_fffffffffffffcc0;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  *this_00;
  string *in_stack_fffffffffffffd30;
  string *in_stack_fffffffffffffd38;
  CLOptions *in_stack_fffffffffffffd40;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_fffffffffffffd78;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  local_268 [4];
  string local_248 [32];
  string local_228 [32];
  _Self local_208;
  _Base_ptr local_200;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  local_1f8;
  string local_1f0 [32];
  string local_1d0 [32];
  _Self local_1b0;
  _Base_ptr local_1a8;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
  local_1a0;
  string local_198 [32];
  string local_178 [32];
  _Self local_158;
  _Base_ptr local_150;
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
  local_148;
  string local_140 [32];
  string local_120 [32];
  _Self local_100;
  _Base_ptr local_f8;
  undefined1 local_f0 [40];
  string local_c8 [32];
  string local_a8 [39];
  allocator local_81;
  string local_80 [48];
  undefined1 local_50 [64];
  string *local_10;
  
  local_10 = in_RSI;
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  getParamName(in_stack_fffffffffffffcb8);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string((string *)(local_50 + 0x20));
  if (((bVar1 ^ 0xff) & 1) != 0) {
    in_stack_fffffffffffffd78 =
         (CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_50;
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getValue(in_stack_fffffffffffffcb8);
    poVar4 = std::operator<<((ostream *)&std::cout,(string *)in_stack_fffffffffffffd78);
    std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
    std::__cxx11::string::~string((string *)local_50);
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"\nUSAGE: ");
  poVar4 = std::operator<<(poVar4,local_10);
  poVar4 = std::operator<<(poVar4," [options]");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  uVar5 = std::__cxx11::string::empty();
  if ((uVar5 & 1) == 0) {
    std::operator<<((ostream *)&std::cout,"\nDESCRIPTION:\n");
    PrintDescription(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                     (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  }
  poVar4 = std::operator<<((ostream *)&std::cout,"\nAVAILABLE OPTIONS:");
  std::ostream::operator<<(poVar4,std::endl<char,std::char_traits<char>>);
  printf("  -h, --help [no argument]\n");
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_80,"Prints out this help information.",&local_81);
  PrintDescription(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                   (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
  std::__cxx11::string::~string(local_80);
  std::allocator<char>::~allocator((allocator<char> *)&local_81);
  CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  getParamName(in_stack_fffffffffffffcb8);
  bVar1 = std::__cxx11::string::empty();
  std::__cxx11::string::~string(local_a8);
  if (((bVar1 ^ 0xff) & 1) != 0) {
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getParamName(in_stack_fffffffffffffcb8);
    uVar9 = std::__cxx11::string::c_str();
    printf("  -v, --%s [no argument]\n",uVar9);
    std::__cxx11::string::~string(local_c8);
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getDescription(in_stack_fffffffffffffcb8);
    PrintDescription(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                     (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
    std::__cxx11::string::~string((string *)(local_f0 + 8));
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
  ::_Rb_tree_iterator((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                       *)local_f0);
  local_f8 = (_Base_ptr)
             std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
             ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
                      *)in_stack_fffffffffffffcb8);
  local_f0._0_8_ = local_f8;
  while( true ) {
    local_100._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>_>
                *)in_stack_fffffffffffffcb8);
    bVar2 = std::operator!=((_Self *)local_f0,&local_100);
    if (!bVar2) break;
    in_stack_fffffffffffffd40 = (CLOptions *)local_f0;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                  *)0x11fdf5);
    in_stack_fffffffffffffd38 = local_120;
    CLParam<bool>::getFullParamName_abi_cxx11_((CLParam<bool> *)in_stack_fffffffffffffd78);
    uVar9 = std::__cxx11::string::c_str();
    ppVar6 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                           *)0x11fe30);
    bVar2 = CLParam<bool>::getDefault((CLParam<bool> *)ppVar6->second);
    printf("  -%s [bool, default=%d]\n",uVar9,(ulong)bVar2);
    std::__cxx11::string::~string((string *)local_120);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
                  *)0x11fe81);
    in_stack_fffffffffffffd30 = local_140;
    CLParam<bool>::getDescription_abi_cxx11_((CLParam<bool> *)in_stack_fffffffffffffcb8);
    PrintDescription(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                     (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
    std::__cxx11::string::~string(local_140);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLBool_*>_>
    ::operator++(in_stack_fffffffffffffcc0);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
  ::_Rb_tree_iterator(&local_148);
  local_150 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
              ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                       *)in_stack_fffffffffffffcb8);
  local_148._M_node = local_150;
  while( true ) {
    local_158._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>_>
                *)in_stack_fffffffffffffcb8);
    bVar2 = std::operator!=(&local_148,&local_158);
    if (!bVar2) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
                  *)0x11ff9a);
    CLParam<double>::getFullParamName_abi_cxx11_((CLParam<double> *)in_stack_fffffffffffffd78);
    uVar9 = std::__cxx11::string::c_str();
    ppVar7 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
                           *)0x11ffc9);
    dVar11 = CLParam<double>::getDefault(&ppVar7->second->super_CLParam<double>);
    printf("  -%s [double, default=%f]\n",dVar11,uVar9);
    std::__cxx11::string::~string(local_178);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
                  *)0x12000f);
    CLParam<double>::getDescription_abi_cxx11_((CLParam<double> *)in_stack_fffffffffffffcb8);
    PrintDescription(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                     (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
    std::__cxx11::string::~string(local_198);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLDouble_*>_>
                  *)in_stack_fffffffffffffcc0);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
  ::_Rb_tree_iterator(&local_1a0);
  local_1a8 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
              ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                       *)in_stack_fffffffffffffcb8);
  local_1a0._M_node = local_1a8;
  while( true ) {
    local_1b0._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>_>
                *)in_stack_fffffffffffffcb8);
    bVar2 = std::operator!=(&local_1a0,&local_1b0);
    if (!bVar2) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
                  *)0x12012e);
    CLParam<int>::getFullParamName_abi_cxx11_((CLParam<int> *)in_stack_fffffffffffffd78);
    uVar9 = std::__cxx11::string::c_str();
    ppVar8 = std::
             _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
             ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
                           *)0x12015d);
    uVar3 = CLParam<int>::getDefault((CLParam<int> *)ppVar8->second);
    printf("  -%s [int, default=%d]\n",uVar9,(ulong)uVar3);
    std::__cxx11::string::~string(local_1d0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
                  *)0x12019f);
    CLParam<int>::getDescription_abi_cxx11_((CLParam<int> *)in_stack_fffffffffffffcb8);
    PrintDescription(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                     (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
    std::__cxx11::string::~string(local_1f0);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
    ::operator++((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLInt_*>_>
                  *)in_stack_fffffffffffffcc0);
  }
  std::
  _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
  ::_Rb_tree_iterator(&local_1f8);
  local_200 = (_Base_ptr)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
              ::begin((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                       *)in_stack_fffffffffffffcb8);
  local_1f8._M_node = local_200;
  while( true ) {
    local_208._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>_>
                *)in_stack_fffffffffffffcb8);
    bVar2 = std::operator!=(&local_1f8,&local_208);
    if (!bVar2) break;
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
                  *)0x1202be);
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getFullParamName(in_stack_fffffffffffffd78);
    uVar9 = std::__cxx11::string::c_str();
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
                  *)0x1202ed);
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getDefault(in_stack_fffffffffffffcb8);
    uVar10 = std::__cxx11::string::c_str();
    printf("  -%s [string, default=%s]\n",uVar9,uVar10);
    std::__cxx11::string::~string(local_248);
    std::__cxx11::string::~string(local_228);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
    ::operator->((_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
                  *)0x12034c);
    this_00 = local_268;
    CLParam<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    getDescription(in_stack_fffffffffffffcb8);
    PrintDescription(in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                     (int)((ulong)in_stack_fffffffffffffd30 >> 0x20));
    std::__cxx11::string::~string((string *)local_268);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CLString_*>_>
    ::operator++(this_00);
  }
  std::ostream::operator<<((ostream *)&std::cout,std::endl<char,std::char_traits<char>>);
  return;
}

Assistant:

void CLOptions::PrintHelp(const std::string& executable_name)
{
    // Print version if available
    if (!version_opt.getParamName().empty()) {
        std::cout << version_opt.getValue() << std::endl;
    }

    // Print usage information
    std::cout << "\nUSAGE: " << executable_name << " [options]" << std::endl;
    
    // Print the descripton of the program
    if (!program_desc_.empty()) {
        std::cout << "\nDESCRIPTION:\n" ;
        PrintDescription(program_desc_, 2) ;
    }
    
    std::cout << "\nAVAILABLE OPTIONS:" << std::endl;
    
    // Specify the help information
    std::printf("  -h, --help [no argument]\n") ;
    PrintDescription("Prints out this help information.") ;
    
    // Specify the version information
    if (!version_opt.getParamName().empty()) {
        std::printf("  -v, --%s [no argument]\n", version_opt.getParamName().c_str()) ;
        PrintDescription(version_opt.getDescription()) ;
    }
    
    // Loop through the parameters and print their current values
    
    // BOOLEANS
    std::map<std::string, CLBool*>::iterator bool_itr ;
    for (bool_itr=params_bools.begin(); bool_itr!=params_bools.end(); ++bool_itr) {
        std::printf("  -%s [bool, default=%d]\n",
                    bool_itr->second->getFullParamName().c_str(),
                    bool_itr->second->getDefault()) ;
        PrintDescription(bool_itr->second->getDescription()) ;
    }
    // DOUBLES
    std::map<std::string, CLDouble*>::iterator dbl_itr ;
    for (dbl_itr=params_doubles.begin(); dbl_itr!=params_doubles.end(); ++dbl_itr) {
        std::printf("  -%s [double, default=%f]\n",
                    dbl_itr->second->getFullParamName().c_str(),
                    dbl_itr->second->getDefault()) ;
        PrintDescription(dbl_itr->second->getDescription()) ;
    }
    // INTEGERS
    std::map<std::string, CLInt*>::iterator int_itr ;
    for (int_itr=params_ints.begin(); int_itr!=params_ints.end(); ++int_itr) {
        std::printf("  -%s [int, default=%d]\n",
                    int_itr->second->getFullParamName().c_str(),
                    int_itr->second->getDefault()) ;
        PrintDescription(int_itr->second->getDescription()) ;
    }
    // STRINGS
    std::map<std::string, CLString*>::iterator str_itr ;
    for (str_itr=params_strings.begin(); str_itr!=params_strings.end(); ++str_itr) {
        std::printf("  -%s [string, default=%s]\n",
                    str_itr->second->getFullParamName().c_str(),
                    str_itr->second->getDefault().c_str()) ;
        PrintDescription(str_itr->second->getDescription()) ;
    }
    std::cout << std::endl;
}